

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_curve_tec(REF_GRID ref_grid,char *filename)

{
  REF_GEOM pRVar1;
  uint uVar2;
  FILE *__stream;
  REF_INT local_4c;
  REF_INT local_48;
  int local_40;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT id;
  REF_INT geom;
  FILE *file;
  REF_GEOM ref_geom;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->geom;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe35,
           "ref_geom_curve_tec","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"refine cad coupling in tecplot format\"\n");
    fprintf(__stream,
            "variables = \"x\" \"y\" \"z\" \"kr\" \"rx\" \"ry\" \"rz\" \"ks\" \"sx\" \"sy\" \"sz\"\n"
           );
    ref_private_macro_code_rss = 0x7fffffff;
    local_40 = -0x80000000;
    for (min_id = 0; min_id < pRVar1->max; min_id = min_id + 1) {
      if (pRVar1->descr[min_id * 6] == 2) {
        if (ref_private_macro_code_rss < pRVar1->descr[min_id * 6 + 1]) {
          local_48 = ref_private_macro_code_rss;
        }
        else {
          local_48 = pRVar1->descr[min_id * 6 + 1];
        }
        ref_private_macro_code_rss = local_48;
        if (pRVar1->descr[min_id * 6 + 1] < local_40) {
          local_4c = local_40;
        }
        else {
          local_4c = pRVar1->descr[min_id * 6 + 1];
        }
        local_40 = local_4c;
      }
    }
    for (max_id = ref_private_macro_code_rss; max_id <= local_40; max_id = max_id + 1) {
      uVar2 = ref_geom_curve_tec_zone(ref_grid,max_id,(FILE *)__stream);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xe44,"ref_geom_curve_tec",(ulong)uVar2,"tec face");
        return uVar2;
      }
    }
    fclose(__stream);
    ref_grid_local._4_4_ = 0;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_curve_tec(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT geom, id, min_id, max_id;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine cad coupling in tecplot format\"\n");
  fprintf(file,
          "variables = \"x\" \"y\" \"z\" \"kr\" \"rx\" \"ry\" \"rz\" "
          "\"ks\" \"sx\" \"sy\" \"sz\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_curve_tec_zone(ref_grid, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}